

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zetDebugAcknowledgeEvent(zet_debug_session_handle_t hDebug,zet_debug_event_t *event)

{
  ze_result_t zVar1;
  
  if (DAT_0010e910 != (code *)0x0) {
    zVar1 = (*DAT_0010e910)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugAcknowledgeEvent(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        const zet_debug_event_t* event                  ///< [in] a pointer to a ::zet_debug_event_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAcknowledgeEvent = context.zetDdiTable.Debug.pfnAcknowledgeEvent;
        if( nullptr != pfnAcknowledgeEvent )
        {
            result = pfnAcknowledgeEvent( hDebug, event );
        }
        else
        {
            // generic implementation
        }

        return result;
    }